

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

int __thiscall jsoncons::basic_staj_event<char>::get<int>(basic_staj_event<char> *this)

{
  error_code ec_00;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  error_code *in_RDI;
  int val;
  error_code ec;
  error_code *in_stack_ffffffffffffffc8;
  basic_staj_event<char> *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8 [12];
  error_code local_18;
  
  std::error_code::error_code(in_RDI);
  iVar2 = get<int>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return iVar2;
  }
  uVar3 = __cxa_allocate_exception(0x58);
  ec_00._M_cat._4_4_ = iVar2;
  ec_00._0_12_ = in_stack_ffffffffffffffd8;
  ser_error::ser_error((ser_error *)local_18._M_cat,ec_00);
  __cxa_throw(uVar3,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

T get() const
    {
        std::error_code ec;
        T val = get<T>(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        return val;
    }